

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  ImVec2 IVar1;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *pIVar2;
  ImGuiWindow *window_00;
  float fVar3;
  float fVar4;
  ImVec2 pos;
  
  pIVar2 = GImGui;
  if (GImGui->MovingWindow == (ImGuiWindow *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) {
      return;
    }
    id = GImGui->ActiveIdWindow->MoveId;
    if (id != GImGui->ActiveId) {
      return;
    }
    KeepAliveID(id);
    if ((pIVar2->IO).MouseDown[0] != false) {
      return;
    }
    ClearActiveID();
    return;
  }
  KeepAliveID(GImGui->ActiveId);
  if ((pIVar2->IO).MouseDown[0] != true) {
LAB_00113a8b:
    ClearActiveID();
    pIVar2->MovingWindow = (ImGuiWindow *)0x0;
    return;
  }
  IVar1 = (pIVar2->IO).MousePos;
  fVar3 = IVar1.x;
  if ((fVar3 < -256000.0) || (fVar4 = IVar1.y, fVar4 < -256000.0)) goto LAB_00113a8b;
  window_00 = pIVar2->MovingWindow;
  window = window_00->RootWindow;
  pos.x = fVar3 - (pIVar2->ActiveIdClickOffset).x;
  pos.y = fVar4 - (pIVar2->ActiveIdClickOffset).y;
  fVar3 = (window->Pos).x;
  if ((fVar3 == pos.x) && (!NAN(fVar3) && !NAN(pos.x))) {
    fVar3 = (window->Pos).y;
    if ((fVar3 == pos.y) && (!NAN(fVar3) && !NAN(pos.y))) goto LAB_00113a84;
  }
  MarkIniSettingsDirty(window);
  SetWindowPos(window,&pos,1);
  window_00 = pIVar2->MovingWindow;
LAB_00113a84:
  FocusWindow(window_00);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            ClearActiveID();
            g.MovingWindow = NULL;
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}